

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-iter.c
# Opt level: O0

void test_bson_iter_fuzz(void)

{
  byte bVar1;
  int iVar2;
  ulong uVar3;
  uint32_t child_len;
  uint8_t *child;
  int pass;
  uint32_t i;
  bson_t *b;
  bson_iter_t iter;
  uint32_t r;
  uint32_t len_le;
  uint32_t len;
  uint8_t *data;
  uint local_11c;
  uint *local_118;
  int local_110;
  uint local_10c;
  long local_108;
  undefined1 local_100 [8];
  uint local_f8;
  int local_f4;
  uint local_d8;
  int local_a4;
  undefined4 local_a0;
  uint local_9c;
  undefined4 *local_98;
  
  local_9c = 0x200;
  local_a0 = 0x200;
  local_110 = 0;
  do {
    if (99999 < local_110) {
      return;
    }
    local_98 = (undefined4 *)bson_malloc0(local_9c);
    *local_98 = local_a0;
    for (local_10c = 4; local_10c < local_9c; local_10c = local_10c + 4) {
      local_a4 = rand();
      *(int *)((long)local_98 + (ulong)local_10c) = local_a4;
    }
    local_108 = bson_new_from_data(local_98,local_9c);
    if (local_108 == 0) {
      bson_free(local_98);
    }
    else {
      if (local_108 == 0) {
        fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-iter.c"
                ,0xf2,"test_bson_iter_fuzz","b");
        abort();
      }
      bVar1 = bson_iter_init(local_100,local_108);
      if ((bVar1 & 1) == 0) {
        fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-iter.c"
                ,0xf9,"test_bson_iter_fuzz","bson_iter_init (&iter, b)");
        abort();
      }
      while (uVar3 = bson_iter_next(local_100), (uVar3 & 1) != 0) {
        if (local_9c <= local_d8) {
          fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
                  "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-iter.c"
                  ,0xfb,"test_bson_iter_fuzz","iter.next_off < len");
          abort();
        }
        iVar2 = bson_iter_type(local_100);
        if (iVar2 == 0) goto LAB_00120341;
        if (1 < iVar2 - 1U) {
          if (iVar2 - 3U < 2) {
            local_118 = (uint *)0x0;
            local_11c = 0;
            bson_iter_document(local_100,&local_11c,&local_118);
            if (local_11c != 0) {
              if (local_118 == (uint *)0x0) {
                fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
                        "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-iter.c"
                        ,0x104,"test_bson_iter_fuzz","child");
                abort();
              }
              if (local_11c < 5) {
                fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
                        "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-iter.c"
                        ,0x105,"test_bson_iter_fuzz","child_len >= 5");
                abort();
              }
              if (*(uint *)(local_108 + 4) <= local_f4 + local_11c) {
                fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
                        "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-iter.c"
                        ,0x106,"test_bson_iter_fuzz","(iter.off + child_len) < b->len");
                abort();
              }
              if (local_11c == 0xffffffff) {
                fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
                        "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-iter.c"
                        ,0x107,"test_bson_iter_fuzz","child_len < (uint32_t) -1");
                abort();
              }
              local_11c = *local_118;
              if (local_11c < 5) {
                fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
                        "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-iter.c"
                        ,0x10a,"test_bson_iter_fuzz","child_len >= 5");
                abort();
              }
            }
          }
          else if (1 < iVar2 - 5U) {
            if (iVar2 == 7) {
              if (local_f8 <= local_f4 + 0xcU) {
                fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
                        "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-iter.c"
                        ,0x113,"test_bson_iter_fuzz","iter.off + 12 < iter.len");
                abort();
              }
            }
            else if (((0xb < iVar2 - 8U) && (iVar2 != 0x7f)) && (iVar2 != 0xff)) {
LAB_00120341:
              fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
                      "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-iter.c"
                      ,0x128,"test_bson_iter_fuzz","false");
              abort();
            }
          }
        }
      }
      bson_destroy(local_108);
      bson_free(local_98);
    }
    local_110 = local_110 + 1;
  } while( true );
}

Assistant:

static void
test_bson_iter_fuzz (void)
{
   uint8_t *data;
   uint32_t len = 512;
   uint32_t len_le;
   uint32_t r;
   bson_iter_t iter;
   bson_t *b;
   uint32_t i;
   int pass;

   len_le = BSON_UINT32_TO_LE (len);

   for (pass = 0; pass < FUZZ_N_PASSES; pass++) {
      data = bson_malloc0 (len);
      memcpy (data, &len_le, sizeof (len_le));

      for (i = 4; i < len; i += 4) {
         r = rand ();
         memcpy (&data[i], &r, sizeof (r));
      }

      if (!(b = bson_new_from_data (data, len))) {
         /*
          * It could fail on buffer length or missing trailing null byte.
          */
         bson_free (data);
         continue;
      }

      BSON_ASSERT (b);

      /*
       * TODO: Most of the following ignores the key. That should be fixed
       *       but has it's own perils too.
       */

      BSON_ASSERT (bson_iter_init (&iter, b));
      while (bson_iter_next (&iter)) {
         BSON_ASSERT (iter.next_off < len);
         switch (bson_iter_type (&iter)) {
         case BSON_TYPE_ARRAY:
         case BSON_TYPE_DOCUMENT: {
            const uint8_t *child = NULL;
            uint32_t child_len = 0;

            bson_iter_document (&iter, &child_len, &child);
            if (child_len) {
               BSON_ASSERT (child);
               BSON_ASSERT (child_len >= 5);
               BSON_ASSERT ((iter.off + child_len) < b->len);
               BSON_ASSERT (child_len < (uint32_t) -1);
               memcpy (&child_len, child, sizeof (child_len));
               child_len = BSON_UINT32_FROM_LE (child_len);
               BSON_ASSERT (child_len >= 5);
            }
         } break;
         case BSON_TYPE_DOUBLE:
         case BSON_TYPE_UTF8:
         case BSON_TYPE_BINARY:
         case BSON_TYPE_UNDEFINED:
            break;
         case BSON_TYPE_OID:
            BSON_ASSERT (iter.off + 12 < iter.len);
            break;
         case BSON_TYPE_BOOL:
         case BSON_TYPE_DATE_TIME:
         case BSON_TYPE_NULL:
         case BSON_TYPE_REGEX:
         /* TODO: check for 2 valid cstring. */
         case BSON_TYPE_DBPOINTER:
         case BSON_TYPE_CODE:
         case BSON_TYPE_SYMBOL:
         case BSON_TYPE_CODEWSCOPE:
         case BSON_TYPE_INT32:
         case BSON_TYPE_TIMESTAMP:
         case BSON_TYPE_INT64:
         case BSON_TYPE_DECIMAL128:
         case BSON_TYPE_MAXKEY:
         case BSON_TYPE_MINKEY:
            break;
         case BSON_TYPE_EOD:
         default:
            /* Code should not be reached. */
            BSON_ASSERT (false);
            break;
         }
      }

      bson_destroy (b);
      bson_free (data);
   }
}